

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O1

ostream * docopt::operator<<(ostream *os,value *val)

{
  pointer pbVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *el;
  pointer pbVar3;
  char *pcVar4;
  ostream *poVar5;
  bool bVar6;
  char local_3c [4];
  ostream *local_38;
  
  switch(val->kind) {
  case Bool:
    value::throwIfNotKind(val,Bool);
    pcVar4 = "false";
    if ((ulong)(val->variant).boolValue != 0) {
      pcVar4 = "true";
    }
    uVar2 = (ulong)(val->variant).boolValue ^ 5;
    poVar5 = (ostream *)&std::cout;
    break;
  case Long:
    value::throwIfNotKind(val,Long);
    std::ostream::_M_insert<long>((long)&std::cout);
    return os;
  case String:
    value::throwIfNotKind(val,String);
    local_3c[2] = 0x22;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_3c + 2,1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)(val->variant).strList.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                        (val->variant).strValue._M_string_length);
    pcVar4 = local_3c + 3;
    local_3c[3] = 0x22;
    uVar2 = 1;
    break;
  case StringList:
    local_38 = os;
    value::throwIfNotKind(val,StringList);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    pbVar3 = (val->variant).strList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (pointer)(val->variant).strValue._M_string_length;
    if (pbVar3 != pbVar1) {
      bVar6 = true;
      do {
        if (bVar6) {
          bVar6 = false;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
        }
        local_3c[0] = '\"';
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_3c,1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length);
        local_3c[1] = 0x22;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_3c + 1,1);
        pbVar3 = pbVar3 + 1;
      } while (pbVar3 != pbVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
    return local_38;
  default:
    poVar5 = (ostream *)&std::cout;
    pcVar4 = "null";
    uVar2 = 4;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,uVar2);
  return os;
}

Assistant:

std::ostream& docopt::operator<<(std::ostream& os, value const& val)
{
	if (val.isBool()) {
		bool b = val.asBool();
		std::cout << (b ? "true" : "false");
	} else if (val.isLong()) {
		long v = val.asLong();
		std::cout << v;
	} else if (val.isString()) {
		std::string const& str = val.asString();
		std::cout << '"' << str << '"';
	} else if (val.isStringList()) {
		auto const& list = val.asStringList();
		std::cout << "[";
		bool first = true;
		for(auto const& el : list) {
			if (first) {
				first = false;
			} else {
				std::cout << ", ";
			}
			std::cout << '"' << el << '"';
		}
		std::cout << "]";
	} else {
		std::cout << "null";
	}
	return os;
}